

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void window_size_suite::window_1(void)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_04;
  reference piVar1;
  int iVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  iterator iVar3;
  iterator iVar4;
  allocator_type local_d5;
  int local_d4;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_1UL> array;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = (_Type)0;
  span.member.cap = 1;
  span.member.size = 0;
  span.member.next = 1;
  iVar2 = 1;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ce,"void window_size_suite::window_1()",piVar1,&expect);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9cf,"void window_size_suite::window_1()",piVar1,&expect);
  __l._M_len = 1;
  __l._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d2,"void window_size_suite::window_1()",iVar3,iVar4,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  iVar2 = 2;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,2);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d6,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d7,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  __l_00._M_len = 1;
  __l_00._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_00._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_00._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9da,"void window_size_suite::window_1()",iVar3,iVar4,second_begin_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  iVar2 = 3;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,3);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9de,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9df,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  __l_01._M_len = 1;
  __l_01._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_01._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_01._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e2,"void window_size_suite::window_1()",iVar3,iVar4,second_begin_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  iVar2 = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,4);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e6,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e7,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  __l_02._M_len = 1;
  __l_02._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_02,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_02._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_02._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ea,"void window_size_suite::window_1()",iVar3,iVar4,second_begin_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  iVar2 = 5;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,5);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ee,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ef,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  __l_03._M_len = 1;
  __l_03._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_03,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_03._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_03._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f2,"void window_size_suite::window_1()",iVar3,iVar4,second_begin_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  iVar2 = 6;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,6);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f6,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f7,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>);
  __l_04._M_len = 1;
  __l_04._M_array = &local_d4;
  local_d4 = iVar2;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_04,&local_d5);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_04._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_04._M_current._0_4_ =
       (int)expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9fa,"void window_size_suite::window_1()",iVar3,iVar4,second_begin_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void window_1()
{
    std::array<int, 1> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(1);
    {
        BOOST_TEST_EQ(span.front(), 1);
        BOOST_TEST_EQ(span.back(), 1);
        std::vector<int> expect = { 1 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(2);
    {
        BOOST_TEST_EQ(span.front(), 2);
        BOOST_TEST_EQ(span.back(), 2);
        std::vector<int> expect = { 2 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(3);
    {
        BOOST_TEST_EQ(span.front(), 3);
        BOOST_TEST_EQ(span.back(), 3);
        std::vector<int> expect = { 3 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(4);
    {
        BOOST_TEST_EQ(span.front(), 4);
        BOOST_TEST_EQ(span.back(), 4);
        std::vector<int> expect = { 4 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(5);
    {
        BOOST_TEST_EQ(span.front(), 5);
        BOOST_TEST_EQ(span.back(), 5);
        std::vector<int> expect = { 5 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(6);
    {
        BOOST_TEST_EQ(span.front(), 6);
        BOOST_TEST_EQ(span.back(), 6);
        std::vector<int> expect = { 6 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}